

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_bool_expr.cpp
# Opt level: O2

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::Transformer::TransformBoolExpr(Transformer *this,PGBoolExpr *root)

{
  int iVar1;
  Transformer *pTVar2;
  optional_ptr<duckdb::Transformer,_true> oVar3;
  ExpressionType EVar4;
  pointer pPVar5;
  pointer pPVar6;
  type expr;
  long in_RDX;
  long lVar7;
  Transformer *pTVar8;
  ExpressionType local_41;
  Transformer *local_40;
  optional_ptr<duckdb::Transformer,_true> local_38;
  
  (this->parent).ptr = (Transformer *)0x0;
  lVar7 = *(long *)(in_RDX + 8);
  do {
    while( true ) {
      lVar7 = *(long *)(lVar7 + 8);
      if (lVar7 == 0) {
        expr = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator*((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                            *)this);
        SetQueryLocation(expr,*(int *)(in_RDX + 0x10));
        return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               )(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 )this;
      }
      TransformExpression((Transformer *)&stack0xffffffffffffffc8,
                          (optional_ptr<duckdb_libpgquery::PGNode,_true>)root);
      iVar1 = *(int *)(in_RDX + 4);
      if (iVar1 == 0) break;
      if (iVar1 == 1) {
        if ((this->parent).ptr != (Transformer *)0x0) {
          local_41 = CONJUNCTION_OR;
          make_uniq<duckdb::ConjunctionExpression,duckdb::ExpressionType,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                    ((duckdb *)&local_40,&local_41,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)this,(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                              *)&stack0xffffffffffffffc8);
          goto LAB_00a6daca;
        }
        goto LAB_00a6da65;
      }
      if (iVar1 != 2) goto LAB_00a6daf6;
      pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                             *)&stack0xffffffffffffffc8);
      if ((pPVar5->super_BaseExpression).type == COMPARE_IN) {
        pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                               *)&stack0xffffffffffffffc8);
        (pPVar5->super_BaseExpression).type = COMPARE_NOT_IN;
      }
      else {
        pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                               *)&stack0xffffffffffffffc8);
        if (((pPVar5->super_BaseExpression).type < COMPARE_BOUNDARY_START) ||
           (pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                     ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                   *)&stack0xffffffffffffffc8),
           COMPARE_GREATERTHANOREQUALTO < (pPVar5->super_BaseExpression).type)) {
          local_41 = OPERATOR_NOT;
          make_uniq<duckdb::OperatorExpression,duckdb::ExpressionType,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                    ((duckdb *)&local_40,&local_41,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)&stack0xffffffffffffffc8);
          goto LAB_00a6daca;
        }
        pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                               *)&stack0xffffffffffffffc8);
        pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                               *)&stack0xffffffffffffffc8);
        EVar4 = NegateComparisonExpression((pPVar6->super_BaseExpression).type);
        (pPVar5->super_BaseExpression).type = EVar4;
      }
      oVar3.ptr = local_38.ptr;
      local_38.ptr = (Transformer *)0x0;
      pTVar8 = (this->parent).ptr;
      (this->parent).ptr = oVar3.ptr;
      if (pTVar8 != (Transformer *)0x0) {
LAB_00a6daf0:
        (*(code *)((pTVar8->parent).ptr)->options)();
LAB_00a6daf6:
        if (local_38.ptr != (Transformer *)0x0) {
          (*(code *)(((local_38.ptr)->parent).ptr)->options)();
        }
      }
    }
    if ((this->parent).ptr != (Transformer *)0x0) {
      local_41 = CONJUNCTION_AND;
      make_uniq<duckdb::ConjunctionExpression,duckdb::ExpressionType,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((duckdb *)&local_40,&local_41,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)this,(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                          *)&stack0xffffffffffffffc8);
LAB_00a6daca:
      pTVar2 = local_40;
      local_40 = (Transformer *)0x0;
      pTVar8 = (this->parent).ptr;
      (this->parent).ptr = pTVar2;
      if ((pTVar8 != (Transformer *)0x0) &&
         ((*(code *)((pTVar8->parent).ptr)->options)(), pTVar8 = local_40,
         local_40 != (Transformer *)0x0)) goto LAB_00a6daf0;
      goto LAB_00a6daf6;
    }
LAB_00a6da65:
    (this->parent).ptr = local_38.ptr;
  } while( true );
}

Assistant:

unique_ptr<ParsedExpression> Transformer::TransformBoolExpr(duckdb_libpgquery::PGBoolExpr &root) {
	unique_ptr<ParsedExpression> result;
	for (auto node = root.args->head; node != nullptr; node = node->next) {
		auto next = TransformExpression(PGPointerCast<duckdb_libpgquery::PGNode>(node->data.ptr_value));

		switch (root.boolop) {
		case duckdb_libpgquery::PG_AND_EXPR: {
			if (!result) {
				result = std::move(next);
			} else {
				result = make_uniq<ConjunctionExpression>(ExpressionType::CONJUNCTION_AND, std::move(result),
				                                          std::move(next));
			}
			break;
		}
		case duckdb_libpgquery::PG_OR_EXPR: {
			if (!result) {
				result = std::move(next);
			} else {
				result = make_uniq<ConjunctionExpression>(ExpressionType::CONJUNCTION_OR, std::move(result),
				                                          std::move(next));
			}
			break;
		}
		case duckdb_libpgquery::PG_NOT_EXPR: {
			if (next->GetExpressionType() == ExpressionType::COMPARE_IN) {
				// convert COMPARE_IN to COMPARE_NOT_IN
				next->SetExpressionTypeUnsafe(ExpressionType::COMPARE_NOT_IN);
				result = std::move(next);
			} else if (next->GetExpressionType() >= ExpressionType::COMPARE_EQUAL &&
			           next->GetExpressionType() <= ExpressionType::COMPARE_GREATERTHANOREQUALTO) {
				// NOT on a comparison: we can negate the comparison
				// e.g. NOT(x > y) is equivalent to x <= y
				next->SetExpressionTypeUnsafe(NegateComparisonExpression(next->GetExpressionType()));
				result = std::move(next);
			} else {
				result = make_uniq<OperatorExpression>(ExpressionType::OPERATOR_NOT, std::move(next));
			}
			break;
		}
		}
	}
	SetQueryLocation(*result, root.location);
	return result;
}